

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_bufs.c
# Opt level: O0

MPP_RET hal_bufs_setup(HalBufs bufs,RK_S32 max_cnt,RK_S32 size_cnt,size_t *sizes)

{
  int iVar1;
  uint uVar2;
  void *pvVar3;
  HalBuf *pHVar4;
  HalBuf *buf;
  int local_40;
  RK_S32 i;
  RK_S32 slot_sum;
  RK_S32 impl_size;
  RK_S32 elem_size;
  MPP_RET ret;
  HalBufsImpl *impl;
  size_t *sizes_local;
  RK_S32 size_cnt_local;
  RK_S32 max_cnt_local;
  HalBufs bufs_local;
  
  if ((bufs == (HalBufs)0x0) || (sizes == (size_t *)0x0)) {
    _mpp_log_l(2,"hal_bufs","invalid NULL input bufs %p sizes %p\n","hal_bufs_setup",bufs,sizes);
    bufs_local._4_4_ = MPP_ERR_NULL_PTR;
  }
  else if ((((max_cnt < 1) || (0x28 < max_cnt)) || (size_cnt < 1)) || (8 < size_cnt)) {
    _mpp_log_l(2,"hal_bufs","invalid max cnt %d size cnt %d\n","hal_bufs_setup",(ulong)(uint)max_cnt
               ,(ulong)(uint)size_cnt);
    bufs_local._4_4_ = MPP_ERR_VALUE;
  }
  else {
    if ((hal_bufs_debug & 1) != 0) {
      _mpp_log_l(4,"hal_bufs","enter\n","hal_bufs_setup");
    }
    hal_bufs_clear((HalBufsImpl *)bufs);
    if (*bufs == 0) {
      impl_size = mpp_buffer_group_get
                            ((MppBufferGroup *)bufs,MPP_BUFFER_TYPE_ION,MPP_BUFFER_INTERNAL,
                             "hal_bufs","hal_bufs_setup");
    }
    else {
      impl_size = mpp_buffer_group_clear(*bufs);
    }
    if ((*bufs == 0) &&
       (_mpp_log_l(2,"hal_bufs","Assertion %s failed at %s:%d\n",(char *)0x0,"impl->group",
                   "hal_bufs_setup",0xb9), (mpp_debug & 0x10000000) != 0)) {
      abort();
    }
    iVar1 = size_cnt * 8 + 0x10;
    uVar2 = iVar1 * max_cnt;
    *(int *)((long)bufs + 0x18) = iVar1;
    pvVar3 = mpp_osal_calloc("hal_bufs_setup",(long)(int)uVar2);
    *(void **)((long)bufs + 0x60) = pvVar3;
    if (*(long *)((long)bufs + 0x60) == 0) {
      _mpp_log_l(2,"hal_bufs","failed to malloc size %d for impl\n","hal_bufs_setup",(ulong)uVar2);
      impl_size = -4;
    }
    else {
      local_40 = 0;
      for (buf._4_4_ = 0; buf._4_4_ < size_cnt; buf._4_4_ = buf._4_4_ + 1) {
        local_40 = local_40 + (int)sizes[buf._4_4_];
        *(size_t *)((long)bufs + (long)buf._4_4_ * 8 + 0x20) = sizes[buf._4_4_];
      }
      *(int *)((long)bufs + 0x14) = local_40;
      for (buf._4_4_ = 0; buf._4_4_ < max_cnt; buf._4_4_ = buf._4_4_ + 1) {
        pHVar4 = hal_bufs_pos((HalBufsImpl *)bufs,buf._4_4_);
        pHVar4->cnt = size_cnt;
        pHVar4->buf = (MppBuffer *)(pHVar4 + 1);
      }
      *(RK_S32 *)((long)bufs + 8) = max_cnt;
      *(RK_S32 *)((long)bufs + 0xc) = size_cnt;
    }
    if ((hal_bufs_debug & 1) != 0) {
      _mpp_log_l(4,"hal_bufs","leave\n","hal_bufs_setup");
    }
    bufs_local._4_4_ = impl_size;
  }
  return bufs_local._4_4_;
}

Assistant:

MPP_RET hal_bufs_setup(HalBufs bufs, RK_S32 max_cnt, RK_S32 size_cnt, size_t sizes[])
{
    HalBufsImpl *impl = (HalBufsImpl *)bufs;
    MPP_RET ret = MPP_OK;
    RK_S32 elem_size = 0;
    RK_S32 impl_size = 0;

    if (NULL == bufs || NULL == sizes) {
        mpp_err_f("invalid NULL input bufs %p sizes %p\n", bufs, sizes);
        return MPP_ERR_NULL_PTR;
    }

    if (max_cnt <= 0 || max_cnt > MAX_HAL_BUFS_CNT ||
        size_cnt <= 0 || size_cnt > MAX_HAL_BUFS_SIZE_CNT) {
        mpp_err_f("invalid max cnt %d size cnt %d\n", max_cnt, size_cnt);
        return MPP_ERR_VALUE;
    }

    hal_bufs_enter();

    hal_bufs_clear(impl);

    if (impl->group)
        ret = mpp_buffer_group_clear(impl->group);
    else
        ret = mpp_buffer_group_get_internal(&impl->group, MPP_BUFFER_TYPE_ION);

    mpp_assert(impl->group);

    elem_size = sizeof(HalBuf) + sizeof(MppBuffer) * size_cnt;
    impl_size = elem_size * max_cnt;

    impl->elem_size = elem_size;
    impl->bufs = mpp_calloc_size(void, impl_size);
    if (impl->bufs) {
        RK_S32 slot_sum = 0;
        RK_S32 i;

        for (i = 0; i < size_cnt; i++) {
            slot_sum += sizes[i];
            impl->sizes[i] = sizes[i];
        }

        impl->slot_sum = slot_sum;

        for (i = 0; i < max_cnt; i++) {
            HalBuf *buf = hal_bufs_pos(impl, i);

            buf->cnt = size_cnt;
            buf->buf = (MppBuffer)(buf + 1);
        }

        impl->max_cnt = max_cnt;
        impl->size_cnt = size_cnt;
    } else {
        mpp_err_f("failed to malloc size %d for impl\n", impl_size);
        ret = MPP_ERR_MALLOC;
    }

    hal_bufs_leave();

    return ret;
}